

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

int __thiscall
slang::SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
          (SmallVectorBase<slang::syntax::TokenOrSyntax> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  TokenOrSyntax *__ifirst;
  uninitialized_copy_result<const_slang::syntax::TokenOrSyntax_*,_slang::syntax::TokenOrSyntax_*>
  uVar1;
  pointer dest;
  undefined1 in_stack_ffffffffffffffc8 [16];
  BumpAllocator *in_stack_ffffffffffffffd8;
  int local_10;
  
  if (this->len == 0) {
    std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::span
              ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x279829);
  }
  else {
    __ifirst = (TokenOrSyntax *)
               BumpAllocator::allocate
                         (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffc8._8_8_,
                          in_stack_ffffffffffffffc8._0_8_);
    begin(this);
    end(this);
    uVar1 = std::ranges::__uninitialized_copy_fn::
            operator()<const_slang::syntax::TokenOrSyntax_*,_const_slang::syntax::TokenOrSyntax_*,_slang::syntax::TokenOrSyntax_*,_slang::syntax::TokenOrSyntax_*>
                      ((__uninitialized_copy_fn *)dst,__ifirst,in_stack_ffffffffffffffc8._8_8_,
                       in_stack_ffffffffffffffc8._0_8_,(TokenOrSyntax *)this);
    std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::
    span<slang::syntax::TokenOrSyntax_*>
              ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)uVar1.out,uVar1.in,
               (size_type)this);
  }
  return local_10;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }